

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall IR::LabelInstr::Dump(LabelInstr *this,IRDumpFlags flags)

{
  char cVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  undefined4 *puVar5;
  char16_t *pcVar6;
  char16_t *form;
  
  if (this->m_block != (BasicBlock *)0x0) {
    BasicBlock::DumpHeader(this->m_block,true);
  }
  if (this->m_name == (char16 *)0x0) {
    Output::Print(L"$L%d:",(ulong)this->m_id);
  }
  else {
    Output::Print(L"$L%d (%s):",(ulong)this->m_id);
  }
  bVar3 = this->field_0x78;
  if ((bVar3 & 2) != 0) {
    Output::Print(L" [helper]");
    bVar3 = this->field_0x78;
  }
  if ((bVar3 & 1) != 0) {
    Output::Print(L" >>>>>>>>>>>>>  LOOP TOP  >>>>>>>>>>>>>");
  }
  if ((this->super_Instr).m_kind == InstrKindProfiledLabel) {
    Output::SkipToColumn(0x32);
    if ((this->super_Instr).m_kind != InstrKindProfiledLabel) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xe3,"(this->IsProfiledLabelInstr())","Bad call to AsProfiledLabelInstr()"
                        );
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    cVar1 = *(char *)&this[1].super_Instr._vptr_Instr;
    pcVar6 = L"Implicit call: yes";
    if (cVar1 == '\x01') {
      pcVar6 = L"Implicit call: no";
    }
    form = L"Implicit call: ???";
    if (cVar1 != '\0') {
      form = pcVar6;
    }
    Output::Print(form);
  }
  if ((flags & (IRDumpFlags_SkipByteCodeOffset|IRDumpFlags_AsmDumpMode)) == IRDumpFlags_None) {
    Instr::DumpByteCodeOffset(&this->super_Instr);
  }
  Output::Print(L"\n");
  return;
}

Assistant:

void
LabelInstr::Dump(IRDumpFlags flags)
{
    if (this->m_block != NULL)
    {
        this->m_block->DumpHeader();
    }
#if DBG
    if (this->m_name != nullptr)
    {
        Output::Print(_u("$L%d (%s):"), this->m_id, this->m_name);
    }
    else
#endif
    {
        Output::Print(_u("$L%d:"), this->m_id);
    }
    if (this->isOpHelper)
    {
        Output::Print(_u(" [helper]"));
    }
    if (this->m_isLoopTop)
    {
        Output::Print(_u(" >>>>>>>>>>>>>  LOOP TOP  >>>>>>>>>>>>>"));
    }
    if (this->IsProfiledLabelInstr())
    {
        Output::SkipToColumn(50);
        switch (this->AsProfiledLabelInstr()->loopImplicitCallFlags)
        {
        case Js::ImplicitCall_HasNoInfo:
            Output::Print(_u("Implicit call: ???"));
            break;
        case Js::ImplicitCall_None:
            Output::Print(_u("Implicit call: no"));
            break;
        default:
            Output::Print(_u("Implicit call: yes"));
            break;
        }
    }
    if ((flags & (IRDumpFlags_AsmDumpMode | IRDumpFlags_SkipByteCodeOffset)) == 0)
    {
        this->DumpByteCodeOffset();
    }
    Output::Print(_u("\n"));
}